

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

long lodepng_filesize(char *filename)

{
  int iVar1;
  FILE *__stream;
  char *in_RDI;
  long size;
  FILE *file;
  long local_20;
  long local_8;
  
  __stream = fopen(in_RDI,"rb");
  if (__stream == (FILE *)0x0) {
    local_8 = -1;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      local_20 = ftell(__stream);
      if (local_20 == 0x7fffffffffffffff) {
        local_20 = -1;
      }
      fclose(__stream);
      local_8 = local_20;
    }
    else {
      fclose(__stream);
      local_8 = -1;
    }
  }
  return local_8;
}

Assistant:

static long lodepng_filesize(const char* filename)
{
  FILE* file;
  long size;
  file = fopen(filename, "rb");
  if(!file) return -1;

  if(fseek(file, 0, SEEK_END) != 0)
  {
    fclose(file);
    return -1;
  }

  size = ftell(file);
  /* It may give LONG_MAX as directory size, this is invalid for us. */
  if(size == LONG_MAX) size = -1;

  fclose(file);
  return size;
}